

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O1

SampledSpectrum __thiscall
pbrt::ImageInfiniteLight::Phi(ImageInfiniteLight *this,SampledWavelengths *lambda)

{
  float fVar1;
  RGB *pRVar2;
  Point2i p;
  ulong uVar3;
  int c;
  int c_00;
  Float FVar4;
  undefined1 auVar5 [16];
  undefined1 extraout_var [56];
  undefined1 auVar6 [56];
  undefined1 auVar7 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar8 [56];
  undefined1 auVar9 [16];
  undefined1 auVar10 [64];
  SampledSpectrum SVar11;
  RGB local_a8;
  ulong local_98;
  Tuple2<pbrt::Point2,_int> local_90;
  ulong local_88;
  ulong local_80;
  SampledWavelengths *local_78;
  ulong local_70;
  undefined1 local_68 [8];
  float fStack_60;
  float fStack_5c;
  RGBSpectrum local_58;
  
  local_90 = (this->image).resolution.super_Tuple2<pbrt::Point2,_int>;
  local_98 = (ulong)local_90 >> 0x20;
  if (local_90.y < 1) {
    auVar9 = ZEXT816(0);
  }
  else {
    local_80 = (ulong)(local_90.x & 0x7fffffff);
    auVar10 = ZEXT864(0);
    local_88 = 0;
    local_78 = lambda;
    do {
      if (0 < local_90.x) {
        local_70 = local_88 << 0x20;
        uVar3 = 0;
        do {
          _local_68 = auVar10._0_16_;
          local_a8.r = 0.0;
          local_a8.g = 0.0;
          local_a8.b = 0.0;
          p.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)(local_70 | uVar3);
          c_00 = 0;
          do {
            FVar4 = Image::GetChannel(&this->image,p,c_00,
                                      (array<pbrt::WrapMode,_2>)
                                      *(array<pbrt::WrapMode,_2> *)(this->wrapMode).wrap.values);
            auVar8 = in_ZMM1._8_56_;
            pRVar2 = &local_a8;
            if ((c_00 != 0) && (pRVar2 = (RGB *)&local_a8.g, c_00 != 1)) {
              pRVar2 = (RGB *)&local_a8.b;
            }
            pRVar2->r = FVar4;
            c_00 = c_00 + 1;
          } while (c_00 != 3);
          auVar6 = extraout_var;
          RGBSpectrum::RGBSpectrum(&local_58,this->imageColorSpace,&local_a8);
          SVar11 = RGBSpectrum::Sample(&local_58,local_78);
          in_ZMM1._0_8_ = SVar11.values.values._8_8_;
          in_ZMM1._8_56_ = auVar8;
          auVar10._0_8_ = SVar11.values.values._0_8_;
          auVar10._8_56_ = auVar6;
          auVar9 = vmovlhps_avx(auVar10._0_16_,in_ZMM1._0_16_);
          auVar10 = ZEXT1664(CONCAT412(auVar9._12_4_ + fStack_5c,
                                       CONCAT48(auVar9._8_4_ + fStack_60,
                                                CONCAT44(auVar9._4_4_ + (float)local_68._4_4_,
                                                         auVar9._0_4_ + (float)local_68._0_4_))));
          uVar3 = uVar3 + 1;
        } while (uVar3 != local_80);
      }
      auVar9 = auVar10._0_16_;
      local_88 = local_88 + 1;
    } while (local_88 != local_98);
  }
  fVar1 = this->sceneRadius * this->sceneRadius * 39.47842 * this->scale;
  auVar7._0_4_ = (float)((int)local_98 * local_90.x);
  auVar5._0_4_ = fVar1 * auVar9._0_4_;
  auVar5._4_4_ = fVar1 * auVar9._4_4_;
  auVar5._8_4_ = fVar1 * auVar9._8_4_;
  auVar5._12_4_ = fVar1 * auVar9._12_4_;
  auVar7._4_4_ = auVar7._0_4_;
  auVar7._8_4_ = auVar7._0_4_;
  auVar7._12_4_ = auVar7._0_4_;
  auVar9 = vdivps_avx(auVar5,auVar7);
  auVar5 = vshufpd_avx(auVar9,auVar9,1);
  SVar11.values.values._0_8_ = auVar9._0_8_;
  SVar11.values.values._8_8_ = auVar5._0_8_;
  return (SampledSpectrum)SVar11.values.values;
}

Assistant:

SampledSpectrum ImageInfiniteLight::Phi(const SampledWavelengths &lambda) const {
    // We're really computing fluence, then converting to power, for what
    // that's worth..
    SampledSpectrum sumL(0.);

    int width = image.Resolution().x, height = image.Resolution().y;
    for (int v = 0; v < height; ++v) {
        for (int u = 0; u < width; ++u) {
            RGB rgb;
            for (int c = 0; c < 3; ++c)
                rgb[c] = image.GetChannel({u, v}, c, wrapMode);
            sumL += RGBSpectrum(*imageColorSpace, rgb).Sample(lambda);
        }
    }
    // Integrating over the sphere, so 4pi for that.  Then one more for Pi
    // r^2 for the area of the disk receiving illumination...
    return 4 * Pi * Pi * Sqr(sceneRadius) * scale * sumL / (width * height);
}